

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

void cfd::capi::GetTxInfo
               (AbstractTransaction *tx,char **txid,char **wtxid,uint32_t *size,uint32_t *vsize,
               uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  int iVar1;
  int32_t iVar2;
  uint32_t uVar3;
  char *pcVar4;
  int *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  AbstractTransaction *in_RDI;
  int *in_R8;
  int *in_R9;
  int32_t *in_stack_00000008;
  uint32_t *in_stack_00000010;
  ByteData256 local_d8;
  Txid local_c0;
  string local_a0 [16];
  undefined8 in_stack_ffffffffffffff70;
  Txid local_70;
  string local_50;
  int *local_30;
  int *local_28;
  int *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  AbstractTransaction *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_RSI != (undefined8 *)0x0) {
    local_10 = in_RSI;
    core::AbstractTransaction::GetTxid(&local_70,in_RDI);
    core::Txid::GetHex_abi_cxx11_(&local_50,&local_70);
    pcVar4 = CreateString((string *)in_stack_ffffffffffffff70);
    *local_10 = pcVar4;
    std::__cxx11::string::~string((string *)&local_50);
    core::Txid::~Txid((Txid *)0x6058b2);
  }
  if (local_18 != (undefined8 *)0x0) {
    core::AbstractTransaction::GetWitnessHash(&local_d8,local_8);
    core::Txid::Txid(&local_c0,&local_d8);
    core::Txid::GetHex_abi_cxx11_((string *)local_a0,&local_c0);
    pcVar4 = CreateString((string *)in_stack_ffffffffffffff70);
    *local_18 = pcVar4;
    std::__cxx11::string::~string(local_a0);
    core::Txid::~Txid((Txid *)0x605972);
    core::ByteData256::~ByteData256((ByteData256 *)0x60597c);
  }
  if (local_20 != (int *)0x0) {
    iVar1 = (*local_8->_vptr_AbstractTransaction[4])();
    *local_20 = iVar1;
  }
  if (local_28 != (int *)0x0) {
    iVar1 = (*local_8->_vptr_AbstractTransaction[5])();
    *local_28 = iVar1;
  }
  if (local_30 != (int *)0x0) {
    iVar1 = (*local_8->_vptr_AbstractTransaction[6])();
    *local_30 = iVar1;
  }
  if (in_stack_00000008 != (int32_t *)0x0) {
    iVar2 = core::AbstractTransaction::GetVersion(local_8);
    *in_stack_00000008 = iVar2;
  }
  if (in_stack_00000010 != (uint32_t *)0x0) {
    uVar3 = core::AbstractTransaction::GetLockTime(local_8);
    *in_stack_00000010 = uVar3;
  }
  return;
}

Assistant:

void GetTxInfo(
    AbstractTransaction* tx, char** txid, char** wtxid, uint32_t* size,
    uint32_t* vsize, uint32_t* weight, uint32_t* version, uint32_t* locktime) {
  if (txid != nullptr) {
    *txid = CreateString(tx->GetTxid().GetHex());
  }
  if (wtxid != nullptr) {
    *wtxid = CreateString(Txid(tx->GetWitnessHash()).GetHex());
  }
  if (size != nullptr) {
    *size = tx->GetTotalSize();
  }
  if (vsize != nullptr) {
    *vsize = tx->GetVsize();
  }
  if (weight != nullptr) {
    *weight = tx->GetWeight();
  }
  if (version != nullptr) {
    *version = tx->GetVersion();
  }
  if (locktime != nullptr) {
    *locktime = tx->GetLockTime();
  }
}